

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

Error __thiscall
miniros::MasterLink::execute
          (MasterLink *this,string *method,RpcValue *request,RpcValue *response,RpcValue *payload,
          bool wait_for_master)

{
  Internal *pIVar1;
  byte bVar2;
  element_type *this_00;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  XmlRpcClient *this_01;
  Error_t EVar7;
  uint __seconds;
  char *method_00;
  WallDuration *rhs;
  string *psVar8;
  void *pvVar9;
  undefined7 in_register_00000089;
  ulong uVar10;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_c0;
  string *local_b8;
  string local_b0;
  undefined4 local_8c;
  RPCManagerPtr manager;
  SteadyTime start_time;
  string master_host;
  
  local_8c = (undefined4)CONCAT71(in_register_00000089,wait_for_master);
  if (this->internal_ == (Internal *)0x0) {
    EVar7 = InternalError;
  }
  else {
    local_b8 = method;
    SteadyTime::now();
    getHost_abi_cxx11_(&master_host,this);
    pIVar1 = this->internal_;
    if (pIVar1 == (Internal *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)pIVar1->port;
    }
    std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2> *)pIVar1);
    this_00 = manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (execute::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
        console::initializeLogLocation(&execute::loc,&local_b0,Error);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if (execute::loc.level_ != Error) {
        console::setLogLocationLevel(&execute::loc,Error);
        console::checkLogLocationEnabled(&execute::loc);
      }
      EVar7 = InternalError;
      if (execute::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,execute::loc.logger_,execute::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0xcb,
                       "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                       ,"[%s] - no manager",(local_b8->_M_dataplus)._M_p);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"/",(allocator<char> *)&local_c0);
      this_01 = RPCManager::getXMLRPCClient(this_00,&master_host,(int)uVar10,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (this_01 == (XmlRpcClient *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
          console::initializeLogLocation
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc,&local_b0,Error);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.level_ != Error) {
          console::setLogLocationLevel
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc,Error);
          console::checkLogLocationEnabled
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc);
        }
        EVar7 = InvalidURI;
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                         ::loc.logger_,
                         execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                         ,0xd0,
                         "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                         ,"[%s] - failed make connection to host=\"%s:%d\"",
                         (local_b8->_M_dataplus)._M_p,master_host._M_dataplus._M_p,uVar10);
        }
      }
      else {
        bVar3 = (byte)local_8c;
        bVar2 = 0;
        bVar6 = false;
        do {
          method_00 = (local_b8->_M_dataplus)._M_p;
          bVar4 = XmlRpc::XmlRpcClient::execute(this_01,method_00,request,response);
          __seconds = (uint)method_00;
          bVar5 = isShuttingDown();
          if (bVar5) {
            bVar5 = false;
LAB_0022b1a2:
            bVar6 = RPCManager::validateXmlrpcResponse
                              (manager.
                               super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_b8,response,payload);
            if (!bVar6) {
              RPCManager::releaseXMLRPCClient
                        (manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,this_01);
              EVar7 = InvalidResponse;
              goto LAB_0022b2ef;
            }
            if ((bool)(bVar2 & bVar5)) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
                console::initializeLogLocation
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,&local_b0,Info);
                std::__cxx11::string::~string((string *)&local_b0);
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.level_ != Info) {
                console::setLogLocationLevel
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,Info);
                console::checkLogLocationEnabled
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc);
              }
              bVar5 = true;
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.logger_,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                               ,0x102,
                               "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                               ,"Connected to master at [%s:%d]",master_host._M_dataplus._M_p,uVar10
                              );
              }
            }
            goto LAB_0022b206;
          }
          bVar5 = RPCManager::isShuttingDown
                            (manager.
                             super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (bVar4 || bVar5) {
            bVar5 = !bVar5;
            goto LAB_0022b1a2;
          }
          if (!bVar6 && ((bVar3 ^ 1) & 1) == 0) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
              psVar8 = &local_b0;
              console::initializeLogLocation
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc,&local_b0,Error);
              __seconds = (uint)psVar8;
              std::__cxx11::string::~string((string *)&local_b0);
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.level_ != Error) {
              __seconds = 3;
              console::setLogLocationLevel
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc,Error);
              console::checkLogLocationEnabled
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc);
            }
            bVar6 = true;
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.logger_enabled_ == true) {
              pvVar9 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                       ::loc.logger_;
              console::print((FilterBase *)0x0,
                             execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                             ::loc.logger_,
                             execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                             ,0xe5,
                             "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                             ,"[%s] Failed to contact master at [%s:%d].  %s",
                             (local_b8->_M_dataplus)._M_p,master_host._M_dataplus._M_p,uVar10,
                             "Retrying...");
              __seconds = (uint)pvVar9;
            }
          }
          if ((char)local_8c == '\0') {
LAB_0022b2df:
            RPCManager::releaseXMLRPCClient
                      (manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,this_01);
            EVar7 = NoMaster;
            goto LAB_0022b2ef;
          }
          bVar4 = DurationBase<miniros::WallDuration>::isZero
                            (&(this->internal_->retry_timeout).
                              super_DurationBase<miniros::WallDuration>);
          if (!bVar4) {
            local_c0 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
            TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator-
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&local_b0,
                       (SteadyTime *)&local_c0);
            rhs = &this->internal_->retry_timeout;
            bVar4 = DurationBase<miniros::WallDuration>::operator>=
                              ((DurationBase<miniros::WallDuration> *)&local_b0,rhs);
            __seconds = (uint)rhs;
            if (bVar4) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
                console::initializeLogLocation
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,&local_b0,Error);
                std::__cxx11::string::~string((string *)&local_b0);
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.level_ != Error) {
                console::setLogLocationLevel
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,Error);
                console::checkLogLocationEnabled
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc);
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.logger_,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                               ,0xef,
                               "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                               ,"[%s] Timed out trying to connect to the master after [%f] seconds",
                               (double)(this->internal_->retry_timeout).
                                       super_DurationBase<miniros::WallDuration>.nsec * 1e-09 +
                               (double)(this->internal_->retry_timeout).
                                       super_DurationBase<miniros::WallDuration>.sec,
                               (local_b8->_M_dataplus)._M_p);
              }
              goto LAB_0022b2df;
            }
          }
          WallDuration::WallDuration((WallDuration *)&local_b0,0.05);
          WallDuration::sleep((WallDuration *)&local_b0,__seconds);
          bVar4 = isShuttingDown();
          if (bVar4) break;
          bVar4 = RPCManager::isShuttingDown
                            (manager.
                             super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          bVar2 = 1;
        } while (!bVar4);
        bVar5 = false;
LAB_0022b206:
        RPCManager::releaseXMLRPCClient
                  (manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,this_01);
        EVar7 = Ok;
        if (!bVar5) {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"miniros.master_link",(allocator<char> *)&local_c0);
            console::initializeLogLocation
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc,&local_b0,Error);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.level_ != Error) {
            console::setLogLocationLevel
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc,Error);
            console::checkLogLocationEnabled
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc);
          }
          EVar7 = ShutdownInterrupt;
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                           ::loc.logger_,
                           execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                           ,0x108,
                           "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                           ,"[%s] Got shutdown request during RPC call",(local_b8->_M_dataplus)._M_p
                          );
          }
        }
      }
    }
LAB_0022b2ef:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&master_host);
  }
  return (Error)EVar7;
}

Assistant:

Error MasterLink::execute(const std::string& method, const RpcValue& request, RpcValue& response,
  RpcValue& payload, bool wait_for_master) const
{
  if (!internal_)
    return Error::InternalError;
  miniros::SteadyTime start_time = miniros::SteadyTime::now();

  std::string master_host = getHost();
  uint32_t master_port = getPort();
  RPCManagerPtr manager = internal_->rpcManager;
  if (!manager) {
    MINIROS_ERROR("[%s] - no manager", method.c_str());
    return Error::InternalError;
  }
  XmlRpc::XmlRpcClient* c = manager->getXMLRPCClient(master_host, master_port, "/");
  if (!c) {
    MINIROS_ERROR("[%s] - failed make connection to host=\"%s:%d\"", method.c_str(), master_host.c_str(), master_port);
    return Error::InvalidURI;
  }
  bool printed = false;
  bool slept = false;
  bool ok = true;
  bool b = false;
  do {
    {
#if defined(__APPLE__)
      std::scoped_lock<std::mutex> lock(internal_->xmlrpc_call_mutex);
#endif

      b = c->execute(method.c_str(), request, response);
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();

    if (!b && ok) {
      if (!printed && wait_for_master) {
        MINIROS_ERROR("[%s] Failed to contact master at [%s:%d].  %s", method.c_str(), master_host.c_str(), master_port,
          wait_for_master ? "Retrying..." : "");
        printed = true;
      }

      if (!wait_for_master) {
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      if (!internal_->retry_timeout.isZero() && (miniros::SteadyTime::now() - start_time) >= internal_->retry_timeout) {
        MINIROS_ERROR("[%s] Timed out trying to connect to the master after [%f] seconds", method.c_str(), internal_->retry_timeout.toSec());
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      (void)miniros::WallDuration(0.05).sleep();
      slept = true;
    } else {
      if (!manager->validateXmlrpcResponse(method, response, payload)) {
        manager->releaseXMLRPCClient(c);
        return Error::InvalidResponse;
      }
      break;
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();
  } while (ok);

  if (ok && slept) {
    MINIROS_INFO("Connected to master at [%s:%d]", master_host.c_str(), master_port);
  }

  manager->releaseXMLRPCClient(c);

  if (!ok) {
    MINIROS_ERROR("[%s] Got shutdown request during RPC call", method.c_str());
    return Error::ShutdownInterrupt;
  }
  return Error::Ok;;
}